

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdbfile.cpp
# Opt level: O0

void ProcessSymbol(ImageSectionStream *imageSectionStream,Record *record,RVAToSymbolMap *toMap)

{
  undefined8 this;
  ulong uVar1;
  bool bVar2;
  pair<const_unsigned_int,_PDBSymbol> local_a8;
  uint local_68;
  undefined1 local_58 [8];
  PDBSymbol symbol;
  RVAToSymbolMap *toMap_local;
  Record *record_local;
  ImageSectionStream *imageSectionStream_local;
  
  symbol._48_8_ = toMap;
  PDBSymbol::PDBSymbol((PDBSymbol *)local_58);
  if ((record->header).kind == S_PUB32) {
    if (((record->data).S_FRAMEPROC.cbFrame & 2) != 0) {
      std::__cxx11::string::operator=
                ((string *)local_58,(char *)((long)&(record->data).S_FRAMEPROC.offPad + 2));
      symbol.rva = (uint32_t)(record->data).S_PUB32.section;
      symbol.length = (record->data).S_FRAMEPROC.cbPad;
    }
  }
  else if ((record->header).kind == S_LPROC32) {
    std::__cxx11::string::operator=((string *)local_58,&record->field_0x27);
    symbol.rva = (uint32_t)(record->data).S_LPROC32.section;
    symbol.length = (record->data).S_LPROC32.offset;
    symbol._28_4_ = (record->data).S_FRAMEPROC.cbSaveRegs;
  }
  else if ((record->header).kind == S_GPROC32) {
    std::__cxx11::string::operator=((string *)local_58,&record->field_0x27);
    symbol.rva = (uint32_t)(record->data).S_LPROC32.section;
    symbol.length = (record->data).S_LPROC32.offset;
    symbol._28_4_ = (record->data).S_FRAMEPROC.cbSaveRegs;
  }
  else if ((record->header).kind == S_LPROC32_ID) {
    std::__cxx11::string::operator=((string *)local_58,&record->field_0x27);
    symbol.rva = (uint32_t)(record->data).S_LPROC32.section;
    symbol.length = (record->data).S_LPROC32.offset;
    symbol._28_4_ = (record->data).S_FRAMEPROC.cbSaveRegs;
  }
  else if ((record->header).kind == S_GPROC32_ID) {
    std::__cxx11::string::operator=((string *)local_58,&record->field_0x27);
    symbol.rva = (uint32_t)(record->data).S_LPROC32.section;
    symbol.length = (record->data).S_LPROC32.offset;
    symbol._28_4_ = (record->data).S_FRAMEPROC.cbSaveRegs;
  }
  else if ((record->header).kind == S_LDATA32) {
    std::__cxx11::string::operator=
              ((string *)local_58,(char *)((long)&(record->data).S_FRAMEPROC.offPad + 2));
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      symbol.rva = (uint32_t)(record->data).S_PUB32.section;
      symbol.length = (record->data).S_FRAMEPROC.cbPad;
      symbol.section = (record->data).S_FRAMEPROC.cbFrame;
    }
  }
  else if ((record->header).kind == S_GDATA32) {
    std::__cxx11::string::operator=
              ((string *)local_58,(char *)((long)&(record->data).S_FRAMEPROC.offPad + 2));
    symbol.rva = (uint32_t)(record->data).S_PUB32.section;
    symbol.length = (record->data).S_FRAMEPROC.cbPad;
    symbol.section = (record->data).S_FRAMEPROC.cbFrame;
  }
  else if ((record->header).kind == S_LTHREAD32) {
    std::__cxx11::string::operator=
              ((string *)local_58,(char *)((long)&(record->data).S_FRAMEPROC.offPad + 2));
    symbol.rva = (uint32_t)(record->data).S_PUB32.section;
    symbol.length = (record->data).S_FRAMEPROC.cbPad;
    symbol.section = (record->data).S_FRAMEPROC.cbFrame;
  }
  else if ((record->header).kind == S_GTHREAD32) {
    std::__cxx11::string::operator=
              ((string *)local_58,(char *)((long)&(record->data).S_FRAMEPROC.offPad + 2));
    symbol.rva = (uint32_t)(record->data).S_PUB32.section;
    symbol.length = (record->data).S_FRAMEPROC.cbPad;
    symbol.section = (record->data).S_FRAMEPROC.cbFrame;
  }
  symbol._24_4_ =
       PDB::ImageSectionStream::ConvertSectionOffsetToRVA
                 (imageSectionStream,(uint16_t)symbol.rva,symbol.length);
  this = symbol._48_8_;
  bVar2 = symbol._24_4_ != 0;
  if (bVar2) {
    std::pair<const_unsigned_int,_PDBSymbol>::pair<unsigned_int_&,_PDBSymbol_&,_true>
              (&local_a8,(uint *)&symbol.field_0x18,(PDBSymbol *)local_58);
    std::
    unordered_map<unsigned_int,_PDBSymbol,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>_>
    ::insert((unordered_map<unsigned_int,_PDBSymbol,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PDBSymbol>_>_>
              *)this,&local_a8);
    std::pair<const_unsigned_int,_PDBSymbol>::~pair(&local_a8);
  }
  local_68 = (uint)!bVar2;
  PDBSymbol::~PDBSymbol((PDBSymbol *)local_58);
  return;
}

Assistant:

static void ProcessSymbol(const PDB::ImageSectionStream& imageSectionStream, const PDB::CodeView::DBI::Record* record, RVAToSymbolMap& toMap)
{
    PDBSymbol symbol;
    if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_PUB32)
    {
        if (PDB_AS_UNDERLYING(record->data.S_PUB32.flags) & PDB_AS_UNDERLYING(PDB::CodeView::DBI::PublicSymbolFlags::Function))
        {
            symbol.name = record->data.S_PUB32.name;
            symbol.section = record->data.S_PUB32.section;
            symbol.offset = record->data.S_PUB32.offset;
        }
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_LPROC32)
    {
        symbol.name = record->data.S_LPROC32.name;
        symbol.section = record->data.S_LPROC32.section;
        symbol.offset = record->data.S_LPROC32.offset;
        symbol.length = record->data.S_LPROC32.codeSize;
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_GPROC32)
    {
        symbol.name = record->data.S_GPROC32.name;
        symbol.section = record->data.S_GPROC32.section;
        symbol.offset = record->data.S_GPROC32.offset;
        symbol.length = record->data.S_GPROC32.codeSize;
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_LPROC32_ID)
    {
        symbol.name = record->data.S_LPROC32_ID.name;
        symbol.section = record->data.S_LPROC32_ID.section;
        symbol.offset = record->data.S_LPROC32_ID.offset;
        symbol.length = record->data.S_LPROC32_ID.codeSize;
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_GPROC32_ID)
    {
        symbol.name = record->data.S_GPROC32_ID.name;
        symbol.section = record->data.S_GPROC32_ID.section;
        symbol.offset = record->data.S_GPROC32_ID.offset;
        symbol.length = record->data.S_GPROC32_ID.codeSize;
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_LDATA32)
    {
        symbol.name = record->data.S_LDATA32.name;
        // Often there are LDATA32 symbols without a name that are same size as function entries? Skip those.
        if (!symbol.name.empty())
        {
            symbol.section = record->data.S_LDATA32.section;
            symbol.offset = record->data.S_LDATA32.offset;
            symbol.typeIndex = record->data.S_LDATA32.typeIndex;
        }
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_GDATA32)
    {
        symbol.name = record->data.S_GDATA32.name;
        symbol.section = record->data.S_GDATA32.section;
        symbol.offset = record->data.S_GDATA32.offset;
        symbol.typeIndex = record->data.S_GDATA32.typeIndex;
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_LTHREAD32)
    {
        symbol.name = record->data.S_LTHREAD32.name;
        symbol.section = record->data.S_LTHREAD32.section;
        symbol.offset = record->data.S_LTHREAD32.offset;
        symbol.typeIndex = record->data.S_LTHREAD32.typeIndex;
    }
    else if (record->header.kind == PDB::CodeView::DBI::SymbolRecordKind::S_GTHREAD32)
    {
        symbol.name = record->data.S_GTHREAD32.name;
        symbol.section = record->data.S_GTHREAD32.section;
        symbol.offset = record->data.S_GTHREAD32.offset;
        symbol.typeIndex = record->data.S_GTHREAD32.typeIndex;
    }
    symbol.rva = imageSectionStream.ConvertSectionOffsetToRVA(symbol.section, symbol.offset);
    if (symbol.rva == 0u)
    {
        // certain symbols (e.g. control-flow guard symbols) don't have a valid RVA, ignore those
        return;
    }

    toMap.insert({ symbol.rva, symbol });
}